

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O2

int cvLsPrecSetupBWrapper
              (sunrealtype t,N_Vector yB,N_Vector fyB,int jokB,int *jcurPtrB,sunrealtype gammaB,
              void *cvode_mem)

{
  int iVar1;
  CVLsMemB cvlsB_mem;
  CVodeBMem cvB_mem;
  CVadjMem ca_mem;
  CVodeMem cv_mem;
  
  iVar1 = cvLs_AccessLMemBCur(cvode_mem,"cvLsPrecSetupBWrapper",&cv_mem,&ca_mem,&cvB_mem,&cvlsB_mem)
  ;
  if (iVar1 == 0) {
    iVar1 = (*ca_mem->ca_IMget)(cv_mem,t,ca_mem->ca_ytmp,(N_Vector *)0x0);
    if (iVar1 == 0) {
      iVar1 = (*cvlsB_mem->psetB)(t,ca_mem->ca_ytmp,yB,fyB,jokB,jcurPtrB,gammaB,
                                  cvB_mem->cv_user_data);
      return iVar1;
    }
    iVar1 = -1;
    cvProcessError(cv_mem,-1,0x9df,"cvLsPrecSetupBWrapper",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_ls.c"
                   ,"Bad t for interpolation.");
  }
  return iVar1;
}

Assistant:

static int cvLsPrecSetupBWrapper(sunrealtype t, N_Vector yB, N_Vector fyB,
                                 sunbooleantype jokB, sunbooleantype* jcurPtrB,
                                 sunrealtype gammaB, void* cvode_mem)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVodeBMem cvB_mem;
  CVLsMemB cvlsB_mem;
  int retval;

  /* access relevant memory structures */
  retval = cvLs_AccessLMemBCur(cvode_mem, "cvLsPrecSetupBWrapper", &cv_mem,
                               &ca_mem, &cvB_mem, &cvlsB_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  /* Get forward solution from interpolation */
  retval = ca_mem->ca_IMget(cv_mem, t, ca_mem->ca_ytmp, NULL);
  if (retval != CV_SUCCESS)
  {
    cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__, MSG_LS_BAD_TINTERP);
    return (-1);
  }

  /* Call user's adjoint precondB routine */
  return (cvlsB_mem->psetB(t, ca_mem->ca_ytmp, yB, fyB, jokB, jcurPtrB, gammaB,
                           cvB_mem->cv_user_data));
}